

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O0

void __thiscall llama_mmap::impl::impl(impl *this,llama_file *file,size_t prefetch,bool numa)

{
  int iVar1;
  pointer ppVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  runtime_error *this_00;
  unsigned_long *puVar6;
  byte in_CL;
  unsigned_long in_RDX;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_RDI;
  int flags;
  int fd;
  pointer in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  size_t local_68;
  undefined1 local_59;
  string local_58 [52];
  uint local_24;
  int local_20;
  byte local_19;
  unsigned_long local_18 [3];
  
  local_19 = in_CL & 1;
  local_18[0] = in_RDX;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x44d209);
  ppVar2 = (pointer)llama_file::size((llama_file *)0x44d216);
  in_RDI[1].
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  local_20 = llama_file::file_id((llama_file *)0x44d22f);
  local_24 = 1;
  if ((local_19 & 1) != 0) {
    local_18[0] = 0;
  }
  iVar1 = posix_fadvise(local_20,0,0,2);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "warning: posix_fadvise(.., POSIX_FADV_SEQUENTIAL) failed: %s\n",pcVar4);
  }
  if (local_18[0] != 0) {
    local_24 = local_24 | 0x8000;
  }
  sVar5 = llama_file::size((llama_file *)0x44d2c6);
  ppVar2 = (pointer)mmap((void *)0x0,sVar5,1,local_24,local_20,0);
  in_RDI[1].
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar2;
  if (in_RDI[1].
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0xffffffffffffffff) {
    if (local_18[0] != 0) {
      in_stack_ffffffffffffff70 =
           in_RDI[1].
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_68 = llama_file::size((llama_file *)0x44d3d2);
      puVar6 = std::min<unsigned_long>(&local_68,local_18);
      iVar1 = posix_madvise(in_stack_ffffffffffffff70,*puVar6,3);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "warning: posix_madvise(.., POSIX_MADV_WILLNEED) failed: %s\n",pcVar4);
      }
    }
    if ((local_19 & 1) != 0) {
      ppVar2 = in_RDI[1].
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = llama_file::size((llama_file *)0x44d449);
      iVar1 = posix_madvise(ppVar2,sVar5,1);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "warning: posix_madvise(.., POSIX_MADV_RANDOM) failed: %s\n",pcVar4);
      }
    }
    llama_file::size((llama_file *)0x44d49c);
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<int,unsigned_long>
              (in_RDI,in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->first);
    return;
  }
  local_59 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  format_abi_cxx11_((char *)local_58,"mmap failed: %s",pcVar4);
  std::runtime_error::runtime_error(this_00,local_58);
  local_59 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

impl(struct llama_file * file, size_t prefetch, bool numa) {
        size = file->size();
        int fd = file->file_id();
        int flags = MAP_SHARED;
        if (numa) { prefetch = 0; }
#ifdef __linux__
        if (posix_fadvise(fd, 0, 0, POSIX_FADV_SEQUENTIAL)) {
            LLAMA_LOG_WARN("warning: posix_fadvise(.., POSIX_FADV_SEQUENTIAL) failed: %s\n",
                    strerror(errno));
        }
        if (prefetch) { flags |= MAP_POPULATE; }
#endif
        addr = mmap(NULL, file->size(), PROT_READ, flags, fd, 0);
        if (addr == MAP_FAILED) {
            throw std::runtime_error(format("mmap failed: %s", strerror(errno)));
        }

        if (prefetch > 0) {
            if (posix_madvise(addr, std::min(file->size(), prefetch), POSIX_MADV_WILLNEED)) {
                LLAMA_LOG_WARN("warning: posix_madvise(.., POSIX_MADV_WILLNEED) failed: %s\n",
                        strerror(errno));
            }
        }
        if (numa) {
            if (posix_madvise(addr, file->size(), POSIX_MADV_RANDOM)) {
                LLAMA_LOG_WARN("warning: posix_madvise(.., POSIX_MADV_RANDOM) failed: %s\n",
                        strerror(errno));
            }
        }

        mapped_fragments.emplace_back(0, file->size());
    }